

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::ParameterizedTestFactory<P256NistzSelectImplTest_SelectW7_Test>::CreateTest
          (ParameterizedTestFactory<P256NistzSelectImplTest_SelectW7_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<P256NistzSelectImpl>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  P256NistzSelectImplTest_SelectW7_Test::P256NistzSelectImplTest_SelectW7_Test
            ((P256NistzSelectImplTest_SelectW7_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }